

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void inc_edx(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  Int32 *pIVar3;
  UInt8 UVar4;
  ulong uVar5;
  UIntPtr UVar6;
  char (*pacVar7) [8];
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  UInt8 UVar11;
  UInt8 UVar12;
  UInt8 UVar13;
  Int64 IVar14;
  bool bVar15;
  
  if ((pMyDisasm->Reserved_).Architecture == 0x40) {
    uVar5 = (pMyDisasm->Reserved_).EndOfBlock;
    if ((uVar5 != 0) && (uVar5 < (pMyDisasm->Reserved_).EIP_ + 2)) {
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
      return;
    }
    if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
      (pMyDisasm->Reserved_).OperandSize = 0x20;
    }
    (pMyDisasm->Reserved_).REX.W_ = '\0';
    (pMyDisasm->Reserved_).REX.R_ = '\0';
    (pMyDisasm->Reserved_).REX.X_ = '\x01';
    (pMyDisasm->Reserved_).REX.B_ = '\0';
    (pMyDisasm->Reserved_).REX.state = '\x01';
    UVar6 = (pMyDisasm->Reserved_).EIP_;
    (pMyDisasm->Reserved_).EIP_ = UVar6 + 1;
    pIVar3 = &(pMyDisasm->Reserved_).NB_PREFIX;
    *pIVar3 = *pIVar3 + 1;
    (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
    (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(UVar6 + 1);
    (*opcode_map1[*(byte *)(UVar6 + 1)])(pMyDisasm);
    (pMyDisasm->Reserved_).OperandSize = 0x20;
    return;
  }
  UVar4 = (pMyDisasm->Prefix).LockPrefix;
  if (UVar4 != '\x01') {
    if (UVar4 != '\x04') goto LAB_0010bd56;
    (pMyDisasm->Prefix).LockPrefix = '\x01';
  }
  (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
LAB_0010bd56:
  (pMyDisasm->Instruction).Category = 0x10002;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"inc",4);
  bVar15 = (pMyDisasm->Reserved_).OperandSize == 0x20;
  pacVar7 = Registers16Bits;
  if (bVar15) {
    pacVar7 = Registers32Bits;
  }
  strcpy((pMyDisasm->Operand1).OpMnemonic,pacVar7[2]);
  IVar14 = REGS[2];
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 1;
  (pMyDisasm->Operand1).Registers.gpr = IVar14;
  (pMyDisasm->Operand1).OpSize = (uint)bVar15 * 0x10 + 0x10;
  (pMyDisasm->Operand1).AccessMode = 3;
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar4 = EFLAGS_TABLE[0x28].NT_;
  UVar8 = EFLAGS_TABLE[0x28].RF_;
  UVar9 = EFLAGS_TABLE[0x28].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x28].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar4;
  (pMyDisasm->Instruction).Flags.RF_ = UVar8;
  (pMyDisasm->Instruction).Flags.alignment = UVar9;
  UVar4 = EFLAGS_TABLE[0x28].SF_;
  UVar8 = EFLAGS_TABLE[0x28].ZF_;
  UVar9 = EFLAGS_TABLE[0x28].AF_;
  UVar10 = EFLAGS_TABLE[0x28].PF_;
  UVar11 = EFLAGS_TABLE[0x28].CF_;
  UVar12 = EFLAGS_TABLE[0x28].TF_;
  UVar13 = EFLAGS_TABLE[0x28].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x28].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar4;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar8;
  (pMyDisasm->Instruction).Flags.AF_ = UVar9;
  (pMyDisasm->Instruction).Flags.PF_ = UVar10;
  (pMyDisasm->Instruction).Flags.CF_ = UVar11;
  (pMyDisasm->Instruction).Flags.TF_ = UVar12;
  (pMyDisasm->Instruction).Flags.IF_ = UVar13;
  return;
}

Assistant:

void __bea_callspec__ inc_edx(PDISASM pMyDisasm)
{
    if (GV.Architecture == 64) {
        if (!Security(2, pMyDisasm)) return;
        if (GV.REX.W_ == 1) GV.OperandSize = 32;
        GV.REX.W_ = 0;
        GV.REX.R_ = 0;
        GV.REX.X_ = 1;
        GV.REX.B_ = 0;
        GV.REX.state = InUsePrefix;
        GV.EIP_++;
        GV.NB_PREFIX++;
        pMyDisasm->Prefix.Number++;
        pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
        (void) opcode_map1[*((UInt8*) GV.EIP_)](pMyDisasm);
        GV.OperandSize = 32;

    }
    else {
        if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
            pMyDisasm->Prefix.LockPrefix = InUsePrefix;
        }
        if (pMyDisasm->Prefix.LockPrefix == InUsePrefix) {
          GV.ERROR_OPCODE = UD_;
        }
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "inc");
        #endif
        if (GV.OperandSize == 32) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[2]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = GENERAL_REG;
            pMyDisasm->Operand1.Registers.gpr = REGS[2+0];
            pMyDisasm->Operand1.OpSize = 32;
            pMyDisasm->Operand1.AccessMode = READ + WRITE;
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[2]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = GENERAL_REG;
            pMyDisasm->Operand1.Registers.gpr = REGS[2+0];
            pMyDisasm->Operand1.OpSize = 16;
            pMyDisasm->Operand1.AccessMode = READ + WRITE;
        }
        GV.EIP_++;
        FillFlags(pMyDisasm, 40);
    }
}